

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoConvert<unsigned_long,double>(Thread *this,Ptr *out_trap)

{
  double val;
  unsigned_long value;
  char *__s;
  Store *store;
  Value VVar1;
  allocator<char> local_69;
  Ptr local_68;
  string local_48;
  
  VVar1 = Pop(this);
  val = (double)VVar1.field_0.f64_;
  if (NAN(val)) {
    store = this->store_;
    __s = "invalid conversion to integer";
  }
  else {
    if ((-1.0 < val) && (val < 1.8446744073709552e+19)) {
      value = Convert<unsigned_long,double>(val);
      Push<unsigned_long>(this,value);
      return Ok;
    }
    store = this->store_;
    __s = "integer overflow";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_69);
  Trap::New(&local_68,store,&local_48,&this->frames_);
  out_trap->obj_ = local_68.obj_;
  out_trap->store_ = local_68.store_;
  out_trap->root_index_ = local_68.root_index_;
  local_68.obj_ = (Trap *)0x0;
  local_68.store_ = (Store *)0x0;
  local_68.root_index_ = 0;
  RefPtr<wabt::interp::Trap>::reset(&local_68);
  std::__cxx11::string::_M_dispose();
  return Trap;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}